

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_hash.hpp
# Opt level: O0

uchar assert_hash::details::file_hash_impl<unsigned_char>(uchar value,char *file,uint exponent)

{
  uchar value_00;
  uint exponent_00;
  uchar local_1d;
  uint exponent_local;
  char *file_local;
  uchar value_local;
  
  local_1d = value;
  if (*file != '\0') {
    value_00 = add_char<unsigned_char>(value,file,exponent);
    exponent_00 = next_exponent<unsigned_char>(exponent);
    local_1d = file_hash_impl<unsigned_char>(value_00,file + 1,exponent_00);
  }
  return local_1d;
}

Assistant:

constexpr T file_hash_impl( const T value, const char* const file, unsigned exponent )
        {
            return *file == 0
                ? value
                : file_hash_impl( add_char< T >( value, file, exponent ), file + 1, next_exponent< T >( exponent ) );
        }